

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void sha256_write_byte_block(sha256_t *p)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint32_t data32 [16];
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint32_t local_118;
  uint local_114;
  uint auStack_a3 [10];
  uint local_78 [18];
  
  lVar9 = 0x2b;
  do {
    uVar1 = *(uint *)((long)p->state + lVar9 + -3);
    *(uint *)((long)auStack_a3 + lVar9) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x6b);
  uVar2 = p->state[1];
  uVar3 = p->state[2];
  uVar1 = p->state[3];
  uVar4 = p->state[4];
  uVar5 = p->state[5];
  uVar6 = p->state[6];
  uVar7 = p->state[7];
  uVar22 = 0xfffffffffffffff0;
  local_154 = 0;
  uVar10 = 0;
  local_150 = 0;
  local_15c = 0;
  local_168 = 0;
  local_164 = 0;
  local_158 = 0;
  local_160 = 0;
  uVar21 = 0;
  uVar13 = 0;
  uVar16 = 0;
  uVar15 = p->state[0];
  uVar8 = uVar4;
  uVar20 = uVar1;
  uVar12 = 0;
  uVar14 = 0;
  uVar19 = 0;
  uVar23 = 0;
  uVar24 = 0;
  local_128 = uVar2;
  local_124 = uVar3;
  local_120 = uVar6;
  local_11c = uVar5;
  local_118 = uVar7;
  do {
    uVar11 = local_78[2];
    uVar17 = local_78[0];
    uVar25 = local_78[1];
    if (uVar22 != 0xfffffffffffffff0) {
      uVar17 = uVar16 + local_164 +
               (uVar10 >> 10 ^ (uVar10 << 0xd | uVar10 >> 0x13) ^ (uVar10 << 0xf | uVar10 >> 0x11))
               + (uVar13 >> 3 ^ (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7));
      uVar11 = uVar21 + local_15c +
               (uVar19 >> 3 ^ (uVar19 << 0xe | uVar19 >> 0x12) ^ (uVar19 << 0x19 | uVar19 >> 7)) +
               (uVar17 >> 10 ^
               (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
      uVar25 = uVar13 + local_168 +
               (local_154 >> 10 ^
               (local_154 << 0xd | local_154 >> 0x13) ^ (local_154 << 0xf | local_154 >> 0x11)) +
               (uVar21 >> 3 ^ (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7));
    }
    uVar13 = uVar25;
    uVar16 = uVar17;
    uVar21 = uVar11;
    local_13c = local_78[3];
    if (uVar22 != 0xfffffffffffffff0) {
      local_13c = uVar19 + uVar24 +
                  (uVar14 >> 3 ^ (uVar14 << 0xe | uVar14 >> 0x12) ^ (uVar14 << 0x19 | uVar14 >> 7))
                  + (uVar13 >> 10 ^
                    (uVar13 << 0xd | uVar13 >> 0x13) ^ (uVar13 << 0xf | uVar13 >> 0x11));
    }
    local_140 = local_78[4];
    if (uVar22 != 0xfffffffffffffff0) {
      local_140 = uVar14 + local_150 +
                  (uVar12 >> 3 ^ (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7))
                  + (uVar21 >> 10 ^
                    (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11));
    }
    local_144 = local_78[5];
    if (uVar22 != 0xfffffffffffffff0) {
      local_144 = uVar12 + uVar10 +
                  (local_160 >> 3 ^
                  (local_160 << 0xe | local_160 >> 0x12) ^ (local_160 << 0x19 | local_160 >> 7)) +
                  (local_13c >> 10 ^
                  (local_13c << 0xd | local_13c >> 0x13) ^ (local_13c << 0xf | local_13c >> 0x11));
    }
    local_148 = local_78[6];
    if (uVar22 != 0xfffffffffffffff0) {
      local_148 = local_160 + local_154 +
                  (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7))
                  + (local_140 >> 10 ^
                    (local_140 << 0xd | local_140 >> 0x13) ^ (local_140 << 0xf | local_140 >> 0x11))
      ;
    }
    local_160 = local_78[7];
    if (uVar22 != 0xfffffffffffffff0) {
      local_160 = uVar23 + uVar16 +
                  (local_158 >> 3 ^
                  (local_158 << 0xe | local_158 >> 0x12) ^ (local_158 << 0x19 | local_158 >> 7)) +
                  (local_144 >> 10 ^
                  (local_144 << 0xd | local_144 >> 0x13) ^ (local_144 << 0xf | local_144 >> 0x11));
    }
    local_14c = local_78[8];
    if (uVar22 != 0xfffffffffffffff0) {
      local_14c = local_158 + uVar13 +
                  (local_164 >> 3 ^
                  (local_164 << 0xe | local_164 >> 0x12) ^ (local_164 << 0x19 | local_164 >> 7)) +
                  (local_148 >> 10 ^
                  (local_148 << 0xd | local_148 >> 0x13) ^ (local_148 << 0xf | local_148 >> 0x11));
    }
    local_158 = local_78[9];
    if (uVar22 != 0xfffffffffffffff0) {
      local_158 = local_164 + uVar21 +
                  (local_168 >> 3 ^
                  (local_168 << 0xe | local_168 >> 0x12) ^ (local_168 << 0x19 | local_168 >> 7)) +
                  (local_160 >> 10 ^
                  (local_160 << 0xd | local_160 >> 0x13) ^ (local_160 << 0xf | local_160 >> 0x11));
    }
    local_164 = local_78[10];
    if (uVar22 != 0xfffffffffffffff0) {
      local_164 = local_168 + local_13c +
                  (local_15c >> 3 ^
                  (local_15c << 0xe | local_15c >> 0x12) ^ (local_15c << 0x19 | local_15c >> 7)) +
                  (local_14c >> 10 ^
                  (local_14c << 0xd | local_14c >> 0x13) ^ (local_14c << 0xf | local_14c >> 0x11));
    }
    local_168 = local_78[0xb];
    if (uVar22 != 0xfffffffffffffff0) {
      local_168 = local_15c + local_140 +
                  (uVar24 >> 3 ^ (uVar24 << 0xe | uVar24 >> 0x12) ^ (uVar24 << 0x19 | uVar24 >> 7))
                  + (local_158 >> 10 ^
                    (local_158 << 0xd | local_158 >> 0x13) ^ (local_158 << 0xf | local_158 >> 0x11))
      ;
    }
    local_15c = local_78[0xc];
    if (uVar22 != 0xfffffffffffffff0) {
      local_15c = uVar24 + local_144 +
                  (local_150 >> 3 ^
                  (local_150 << 0xe | local_150 >> 0x12) ^ (local_150 << 0x19 | local_150 >> 7)) +
                  (local_164 >> 10 ^
                  (local_164 << 0xd | local_164 >> 0x13) ^ (local_164 << 0xf | local_164 >> 0x11));
    }
    local_114 = local_78[0xd];
    if (uVar22 != 0xfffffffffffffff0) {
      local_114 = local_150 + local_148 +
                  (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7))
                  + (local_168 >> 10 ^
                    (local_168 << 0xd | local_168 >> 0x13) ^ (local_168 << 0xf | local_168 >> 0x11))
      ;
    }
    uVar12 = local_78[0xe];
    if (uVar22 != 0xfffffffffffffff0) {
      uVar12 = uVar10 + local_160 +
               (local_154 >> 3 ^
               (local_154 << 0xe | local_154 >> 0x12) ^ (local_154 << 0x19 | local_154 >> 7)) +
               (local_15c >> 10 ^
               (local_15c << 0xd | local_15c >> 0x13) ^ (local_15c << 0xf | local_15c >> 0x11));
    }
    uVar10 = uVar12;
    uVar11 = local_78[0xf];
    if (uVar22 != 0xfffffffffffffff0) {
      uVar11 = local_154 + local_14c +
               (uVar16 >> 3 ^ (uVar16 << 0xe | uVar16 >> 0x12) ^ (uVar16 << 0x19 | uVar16 >> 7)) +
               (local_114 >> 10 ^
               (local_114 << 0xd | local_114 >> 0x13) ^ (local_114 << 0xf | local_114 >> 0x11));
    }
    iVar18 = ((local_11c ^ local_120) & uVar8 ^ local_120) + local_118 +
             ((uVar8 << 7 | uVar8 >> 0x19) ^
             (uVar8 << 0x15 | uVar8 >> 0xb) ^ (uVar8 << 0x1a | uVar8 >> 6)) + uVar16 +
             K[uVar22 + 0x10];
    uVar20 = uVar20 + iVar18;
    uVar14 = ((uVar15 | local_128) & local_124 | uVar15 & local_128) +
             ((uVar15 << 10 | uVar15 >> 0x16) ^
             (uVar15 << 0x13 | uVar15 >> 0xd) ^ (uVar15 << 0x1e | uVar15 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x11] + local_120 + ((uVar8 ^ local_11c) & uVar20 ^ local_11c) + uVar13 +
             ((uVar20 * 0x80 | uVar20 >> 0x19) ^
             (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
    uVar23 = local_124 + iVar18;
    uVar19 = ((uVar14 | uVar15) & local_128 | uVar14 & uVar15) +
             ((uVar14 * 0x400 | uVar14 >> 0x16) ^
             (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x12] + local_11c + ((uVar20 ^ uVar8) & uVar23 ^ uVar8) + uVar21 +
             ((uVar23 * 0x80 | uVar23 >> 0x19) ^
             (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
    uVar24 = local_128 + iVar18;
    uVar12 = ((uVar19 | uVar14) & uVar15 | uVar19 & uVar14) +
             ((uVar19 * 0x400 | uVar19 >> 0x16) ^
             (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x13] + uVar8 + ((uVar23 ^ uVar20) & uVar24 ^ uVar20) + local_13c +
             ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6));
    uVar15 = uVar15 + iVar18;
    uVar8 = ((uVar12 | uVar19) & uVar14 | uVar12 & uVar19) +
            ((uVar12 * 0x400 | uVar12 >> 0x16) ^
            (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x14] + uVar20 + ((uVar24 ^ uVar23) & uVar15 ^ uVar23) + local_140 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6));
    uVar14 = uVar14 + iVar18;
    uVar20 = ((uVar8 | uVar12) & uVar19 | uVar8 & uVar12) +
             ((uVar8 * 0x400 | uVar8 >> 0x16) ^
             (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x15] + uVar23 + ((uVar15 ^ uVar24) & uVar14 ^ uVar24) + local_144 +
             ((uVar14 * 0x80 | uVar14 >> 0x19) ^
             (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6));
    uVar19 = uVar19 + iVar18;
    uVar23 = ((uVar20 | uVar8) & uVar12 | uVar20 & uVar8) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x16] + uVar24 + ((uVar14 ^ uVar15) & uVar19 ^ uVar15) + local_148 +
             ((uVar19 * 0x80 | uVar19 >> 0x19) ^
             (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
    uVar12 = uVar12 + iVar18;
    uVar24 = ((uVar23 | uVar20) & uVar8 | uVar23 & uVar20) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x17] + uVar15 + ((uVar19 ^ uVar14) & uVar12 ^ uVar14) + local_160 +
             ((uVar12 * 0x80 | uVar12 >> 0x19) ^
             (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6));
    uVar8 = uVar8 + iVar18;
    uVar25 = ((uVar24 | uVar23) & uVar20 | uVar24 & uVar23) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x18] + uVar14 + ((uVar12 ^ uVar19) & uVar8 ^ uVar19) + local_14c +
             ((uVar8 * 0x80 | uVar8 >> 0x19) ^
             (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
    uVar20 = uVar20 + iVar18;
    uVar17 = ((uVar25 | uVar24) & uVar23 | uVar25 & uVar24) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x19] + uVar19 + ((uVar8 ^ uVar12) & uVar20 ^ uVar12) + local_158 +
             ((uVar20 * 0x80 | uVar20 >> 0x19) ^
             (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
    uVar23 = uVar23 + iVar18;
    uVar14 = ((uVar17 | uVar25) & uVar24 | uVar17 & uVar25) +
             ((uVar17 * 0x400 | uVar17 >> 0x16) ^
             (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x1a] + uVar12 + ((uVar20 ^ uVar8) & uVar23 ^ uVar8) + local_164 +
             ((uVar23 * 0x80 | uVar23 >> 0x19) ^
             (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
    uVar24 = uVar24 + iVar18;
    uVar15 = ((uVar14 | uVar17) & uVar25 | uVar14 & uVar17) +
             ((uVar14 * 0x400 | uVar14 >> 0x16) ^
             (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x1b] + uVar8 + ((uVar23 ^ uVar20) & uVar24 ^ uVar20) + local_168 +
             ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6));
    uVar25 = uVar25 + iVar18;
    uVar8 = ((uVar15 | uVar14) & uVar17 | uVar15 & uVar14) +
            ((uVar15 * 0x400 | uVar15 >> 0x16) ^
            (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x1c] + uVar20 + ((uVar24 ^ uVar23) & uVar25 ^ uVar23) + local_15c +
             ((uVar25 * 0x80 | uVar25 >> 0x19) ^
             (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6));
    local_118 = uVar17 + iVar18;
    uVar20 = ((uVar8 | uVar15) & uVar14 | uVar8 & uVar15) +
             ((uVar8 * 0x400 | uVar8 >> 0x16) ^
             (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar18;
    local_150 = local_114;
    iVar18 = K[uVar22 + 0x1d] + uVar23 + ((uVar25 ^ uVar24) & local_118 ^ uVar24) + local_114 +
             ((local_118 * 0x80 | local_118 >> 0x19) ^
             (local_118 * 0x200000 | local_118 >> 0xb) ^ (local_118 * 0x4000000 | local_118 >> 6));
    local_120 = uVar14 + iVar18;
    local_124 = ((uVar20 | uVar8) & uVar15 | uVar20 & uVar8) +
                ((uVar20 * 0x400 | uVar20 >> 0x16) ^
                (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar18;
    iVar18 = K[uVar22 + 0x1e] + uVar24 + ((local_118 ^ uVar25) & local_120 ^ uVar25) + uVar10 +
             ((local_120 * 0x80 | local_120 >> 0x19) ^
             (local_120 * 0x200000 | local_120 >> 0xb) ^ (local_120 * 0x4000000 | local_120 >> 6));
    local_11c = uVar15 + iVar18;
    local_128 = ((local_124 | uVar20) & uVar8 | local_124 & uVar20) +
                ((local_124 * 0x400 | local_124 >> 0x16) ^
                (local_124 * 0x80000 | local_124 >> 0xd) ^ (local_124 * 0x40000000 | local_124 >> 2)
                ) + iVar18;
    iVar18 = K[uVar22 + 0x1f] + uVar25 + ((local_120 ^ local_118) & local_11c ^ local_118) + uVar11
             + ((local_11c * 0x80 | local_11c >> 0x19) ^
               (local_11c * 0x200000 | local_11c >> 0xb) ^ (local_11c * 0x4000000 | local_11c >> 6))
    ;
    uVar8 = uVar8 + iVar18;
    uVar15 = ((local_128 | local_124) & uVar20 | local_128 & local_124) +
             ((local_128 * 0x400 | local_128 >> 0x16) ^
             (local_128 * 0x80000 | local_128 >> 0xd) ^ (local_128 * 0x40000000 | local_128 >> 2)) +
             iVar18;
    uVar22 = uVar22 + 0x10;
    uVar17 = local_168;
    local_168 = local_164;
    local_164 = local_158;
    local_158 = local_14c;
    uVar12 = local_144;
    uVar14 = local_140;
    uVar19 = local_13c;
    uVar23 = local_160;
    uVar24 = local_15c;
    local_160 = local_148;
    local_15c = uVar17;
    local_154 = uVar11;
  } while (uVar22 < 0x30);
  p->state[0] = uVar15 + p->state[0];
  p->state[1] = local_128 + uVar2;
  p->state[2] = local_124 + uVar3;
  p->state[3] = uVar20 + uVar1;
  p->state[4] = uVar8 + uVar4;
  p->state[5] = local_11c + uVar5;
  p->state[6] = local_120 + uVar6;
  p->state[7] = local_118 + uVar7;
  return;
}

Assistant:

static void
sha256_write_byte_block(sha256_t *p)
{
  uint32_t data32[16];
  unsigned i;
  for (i = 0; i < 16; i++)
    data32[i] =
      ((uint32_t)(p->buffer[i * 4    ]) << 24) +
      ((uint32_t)(p->buffer[i * 4 + 1]) << 16) +
      ((uint32_t)(p->buffer[i * 4 + 2]) <<  8) +
      ((uint32_t)(p->buffer[i * 4 + 3]));
  sha256_transform(p->state, data32);
}